

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::~QGraphicsView(QGraphicsView *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QGraphicsView *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007ee760;
  *(undefined ***)(this + 0x10) = &PTR__QGraphicsView_007ee950;
  lVar1 = *(long *)(this + 8);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x490));
  if (bVar2) {
    local_20 = this;
    QtPrivate::sequential_erase_with_copy<QList<QGraphicsView*>,QGraphicsView*>
              ((QList<QGraphicsView_*> *)(*(long *)(*(long *)(lVar1 + 0x498) + 8) + 0x280),
               (QGraphicsView **)&local_20);
  }
  if (*(long **)(lVar1 + 0x520) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x520) + 8))();
  }
  QAbstractScrollArea::~QAbstractScrollArea((QAbstractScrollArea *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsView::~QGraphicsView()
{
    Q_D(QGraphicsView);
    if (d->scene)
        d->scene->d_func()->views.removeAll(this);
    delete d->lastDragDropEvent;
}